

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
          (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
           *this,GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *os)

{
  Ch c;
  long lVar1;
  Ch c_00;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  Ch *pCVar5;
  GenericStringStream<rapidjson::UTF8<char>_> source;
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  target;
  
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x42e,
                  "bool rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Stringify(OutputStream &) const [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator, uriFragment = true, OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>]"
                 );
  }
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,'#');
  plVar3 = *(long **)(this + 0x18);
  for (plVar4 = plVar3; lVar1 = *(long *)(this + 0x20), plVar4 != plVar3 + lVar1 * 2;
      plVar4 = plVar4 + 2) {
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,'/');
    for (pCVar5 = (Ch *)0x0; pCVar5 < (Ch *)(ulong)*(uint *)(plVar4 + 1); pCVar5 = pCVar5 + 1) {
      c = pCVar5[*plVar4];
      if (c == '/') {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,'~');
        c_00 = '1';
LAB_001229c3:
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,c_00);
      }
      else {
        if (c == '~') {
          GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,'~');
          c_00 = '0';
          goto LAB_001229c3;
        }
        bVar2 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::NeedPercentEncode((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                     *)this,c);
        if (bVar2) {
          source.src_ = pCVar5 + *plVar4;
          source.head_ = source.src_;
          target.os_ = os;
          bVar2 = UTF8<char>::
                  Validate<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>>
                            (&source,&target);
          if (!bVar2) goto LAB_00122a43;
          pCVar5 = source.src_ + (long)(pCVar5 + ~(ulong)source.head_);
        }
        else {
          GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(os,c);
        }
      }
    }
    plVar3 = *(long **)(this + 0x18);
  }
LAB_00122a43:
  return plVar4 == plVar3 + lVar1 * 2;
}

Assistant:

bool IsValid() const { return parseErrorCode_ == kPointerParseErrorNone; }